

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type jsoncons::decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (char *first,char *last,vector<unsigned_char,_std::allocator<unsigned_char>_> *result
               )

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  byte *__x;
  byte *in_RSI;
  byte *in_RDI;
  type tVar2;
  char b;
  char a;
  uint8_t val;
  char *it;
  size_t len;
  char *in_stack_ffffffffffffffc8;
  byte *pbVar3;
  char *in_stack_ffffffffffffffd0;
  byte *local_10;
  undefined4 local_8;
  
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::distance<char_const*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pbVar3 = in_RDI;
  local_10 = in_RDI;
  if (((ulong)this & 1) == 0) {
    while (pbVar3 != in_RSI) {
      bVar1 = *pbVar3;
      if ((((char)bVar1 < '0') || ('9' < (char)bVar1)) &&
         (((char)(bVar1 | 0x20) < 'a' || ('f' < (char)(bVar1 | 0x20))))) {
        local_8 = 0x18;
        goto LAB_002b1de4;
      }
      __x = pbVar3 + 2;
      bVar1 = pbVar3[1];
      if ((((char)bVar1 < '0') || ('9' < (char)bVar1)) &&
         (((char)(bVar1 | 0x20) < 'a' || ('f' < (char)(bVar1 | 0x20))))) {
        local_8 = 0x18;
        goto LAB_002b1de4;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this,__x);
      pbVar3 = __x;
    }
    local_8 = 0;
    local_10 = in_RSI;
  }
  else {
    local_8 = 0x18;
  }
LAB_002b1de4:
  tVar2.ec = local_8;
  tVar2.it = (char *)local_10;
  tVar2._12_4_ = 0;
  return tVar2;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base16(InputIt first, InputIt last, Container& result)
    {
        std::size_t len = std::distance(first,last);
        if (len & 1) 
        {
            return decode_result<InputIt>{first, conv_errc::not_base16};
        }

        InputIt it = first;
        while (it != last)
        {
            uint8_t val;
            auto a = *it++;
            if (a >= '0' && a <= '9') 
            {
                val = static_cast<uint8_t>(a - '0') << 4;
            } 
            else if ((a | 0x20) >= 'a' && (a | 0x20) <= 'f') 
            {
                val = (static_cast<uint8_t>((a | 0x20) - 'a') + 10) << 4;
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            auto b = *it++;
            if (b >= '0' && b <= '9') 
            {
                val |= (b - '0');
            } 
            else if ((b | 0x20) >= 'a' && (b | 0x20) <= 'f') 
            {
                val |= ((b | 0x20) - 'a' + 10);
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            result.push_back(val);
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }